

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

IntegerType * __thiscall TypeHandler::setSigned(TypeHandler *this,IntegerType *ty)

{
  IntegerType *pIVar1;
  IntegerType *pIVar2;
  IntegerType *in_RSI;
  unique_ptr<CharType,_std::default_delete<CharType>_> *in_stack_ffffffffffffffc0;
  IntegerType *local_8;
  
  pIVar1 = &std::unique_ptr<IntType,_std::default_delete<IntType>_>::get
                      ((unique_ptr<IntType,_std::default_delete<IntType>_> *)
                       in_stack_ffffffffffffffc0)->super_IntegerType;
  if (in_RSI == pIVar1) {
    local_8 = &std::unique_ptr<IntType,_std::default_delete<IntType>_>::get
                         ((unique_ptr<IntType,_std::default_delete<IntType>_> *)
                          in_stack_ffffffffffffffc0)->super_IntegerType;
  }
  else {
    pIVar1 = &std::unique_ptr<CharType,_std::default_delete<CharType>_>::get
                        (in_stack_ffffffffffffffc0)->super_IntegerType;
    if (in_RSI == pIVar1) {
      local_8 = &std::unique_ptr<CharType,_std::default_delete<CharType>_>::get
                           (in_stack_ffffffffffffffc0)->super_IntegerType;
    }
    else {
      pIVar1 = &std::unique_ptr<ShortType,_std::default_delete<ShortType>_>::get
                          ((unique_ptr<ShortType,_std::default_delete<ShortType>_> *)
                           in_stack_ffffffffffffffc0)->super_IntegerType;
      if (in_RSI == pIVar1) {
        local_8 = &std::unique_ptr<ShortType,_std::default_delete<ShortType>_>::get
                             ((unique_ptr<ShortType,_std::default_delete<ShortType>_> *)
                              in_stack_ffffffffffffffc0)->super_IntegerType;
      }
      else {
        pIVar1 = in_RSI;
        pIVar2 = &std::unique_ptr<LongType,_std::default_delete<LongType>_>::get
                            ((unique_ptr<LongType,_std::default_delete<LongType>_> *)in_RSI)->
                  super_IntegerType;
        local_8 = in_RSI;
        if (pIVar1 == pIVar2) {
          local_8 = &std::unique_ptr<LongType,_std::default_delete<LongType>_>::get
                               ((unique_ptr<LongType,_std::default_delete<LongType>_> *)pIVar1)->
                     super_IntegerType;
        }
      }
    }
  }
  return local_8;
}

Assistant:

IntegerType* TypeHandler::setSigned(IntegerType* ty) {
#define TYPES(unsignedType,signedType) \
    do {\
        if (ty == unsignedType.get()) return signedType.get();\
    } while(0);

    TYPES(uint, sint);
    TYPES(uchar, schar);
    TYPES(ushort, sshort);
    TYPES(ulong, slong);

#undef TYPES
    return ty;
}